

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::HashMap<capnp::Type,kj::Own<capnp::JsonCodec::AnnotatedEnumHandler>>::Callbacks>::
insert<kj::HashMap<capnp::Type,kj::Own<capnp::JsonCodec::AnnotatedEnumHandler>>::Entry,capnp::EnumSchema&>
          (HashIndex<kj::HashMap<capnp::Type,kj::Own<capnp::JsonCodec::AnnotatedEnumHandler>>::Callbacks>
           *this,ArrayPtr<kj::HashMap<capnp::Type,_kj::Own<capnp::JsonCodec::AnnotatedEnumHandler>_>::Entry>
                 table,size_t pos,EnumSchema *params)

{
  uint uVar1;
  RawBrandedSchema *pRVar2;
  ulong uVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar8;
  HashBucket *pHVar9;
  uint hash;
  HashIndex<kj::HashMap<capnp::Type,_kj::Own<capnp::JsonCodec::AnnotatedEnumHandler>_>::Callbacks>
  *this_00;
  ulong targetSize;
  EnumSchema *in_R9;
  size_t sVar10;
  HashBucket *s;
  HashBucket *pHVar11;
  Maybe<unsigned_long> MVar12;
  
  this_00 = (HashIndex<kj::HashMap<capnp::Type,_kj::Own<capnp::JsonCodec::AnnotatedEnumHandler>_>::Callbacks>
             *)table.ptr;
  sVar10 = (this_00->buckets).size_;
  uVar3 = sVar10 * 2;
  if (uVar3 < (this_00->erasedCount + pos) * 3 + 3) {
    targetSize = pos * 2 + 2;
    if (targetSize < uVar3) {
      targetSize = uVar3;
    }
    HashIndex<kj::HashMap<capnp::Type,_kj::Own<capnp::JsonCodec::AnnotatedEnumHandler>_>::Callbacks>
    ::rehash(this_00,targetSize);
    sVar10 = (this_00->buckets).size_;
  }
  pRVar2 = (in_R9->super_Schema).raw;
  iVar5 = (int)((ulong)pRVar2 >> 0x20) * 0xbfe3;
  iVar7 = -(int)pRVar2;
  hash = (uint)(iVar5 != iVar7);
  uVar6 = kj::_::chooseBucket(hash,(uint)sVar10);
  pHVar11 = (HashBucket *)0x0;
  aVar8 = extraout_RDX;
  do {
    pHVar9 = (this_00->buckets).ptr + uVar6;
    uVar1 = pHVar9->value;
    if (uVar1 == 1) {
      if (pHVar11 == (HashBucket *)0x0) {
        pHVar11 = pHVar9;
      }
    }
    else {
      if (uVar1 == 0) {
        if (pHVar11 != (HashBucket *)0x0) {
          this_00->erasedCount = this_00->erasedCount - 1;
          pHVar9 = pHVar11;
        }
        *pHVar9 = (HashBucket)(((ulong)(iVar5 != iVar7) | (long)params << 0x20) + 0x200000000);
        *this = (HashIndex<kj::HashMap<capnp::Type,kj::Own<capnp::JsonCodec::AnnotatedEnumHandler>>::Callbacks>
                 )0x0;
        goto LAB_00233db8;
      }
      if (pHVar9->hash == hash) {
        bVar4 = HashMap<capnp::Type,kj::Own<capnp::JsonCodec::AnnotatedEnumHandler>>::Callbacks::
                matches<capnp::EnumSchema&>
                          ((Callbacks *)this_00,(Entry *)((ulong)(uVar1 - 2) * 0x20 + table.size_),
                           in_R9);
        aVar8 = extraout_RDX_00;
        if (bVar4) {
          uVar1 = pHVar9->value;
          *this = (HashIndex<kj::HashMap<capnp::Type,kj::Own<capnp::JsonCodec::AnnotatedEnumHandler>>::Callbacks>
                   )0x1;
          *(ulong *)(this + 8) = (ulong)(uVar1 - 2);
LAB_00233db8:
          MVar12.ptr.field_1.value = aVar8.value;
          MVar12.ptr._0_8_ = this;
          return (Maybe<unsigned_long>)MVar12.ptr;
        }
      }
    }
    sVar10 = (ulong)uVar6 + 1;
    uVar6 = 0;
    if (sVar10 != (this_00->buckets).size_) {
      uVar6 = (uint)sVar10;
    }
  } while( true );
}

Assistant:

kj::Maybe<size_t> insert(kj::ArrayPtr<Row> table, size_t pos, Params&&... params) {
    if (buckets.size() * 2 < (table.size() + 1 + erasedCount) * 3) {
      // Load factor is more than 2/3, let's rehash.
      rehash(kj::max(buckets.size() * 2, (table.size() + 1) * 2));
    }

    uint hashCode = cb.hashCode(params...);
    Maybe<_::HashBucket&> erasedSlot;
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // no duplicates found
        KJ_IF_MAYBE(s, erasedSlot) {
          --erasedCount;
          *s = { hashCode, uint(pos) };
        } else {
          bucket = { hashCode, uint(pos) };
        }
        return nullptr;
      } else if (bucket.isErased()) {
        // We can fill in the erased slot. However, we have to keep searching to make sure there
        // are no duplicates before we do that.
        if (erasedSlot == nullptr) {
          erasedSlot = bucket;
        }
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // duplicate row
        return size_t(bucket.getPos());
      }
    }